

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

void uv::TCPClient::ReconnectTimer(uv_timer_t *handle)

{
  char *__s;
  void *pvVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ILog4zManager *pIVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_t __maxlen;
  char *pcVar10;
  long *in_FS_OFFSET;
  sockaddr_in6 bind_addr;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_4c [28];
  
  pvVar1 = handle->data;
  if (*(char *)((long)pvVar1 + 0x588) != '\x01') {
    return;
  }
  lVar2 = *in_FS_OFFSET;
  __s = (char *)(lVar2 + -0x800);
  builtin_strncpy(__s,"star",4);
  builtin_strncpy((char *)(lVar2 + -0x7fc),"t re",4);
  builtin_strncpy((char *)(lVar2 + -0x7f8),"conn",4);
  builtin_strncpy((char *)(lVar2 + -0x7f4),"ect.",4);
  *(undefined4 *)(lVar2 + -0x7f0) = 0xa2e2e;
  *(undefined4 *)(lVar2 + -0x7ed) = 0x202820;
  *(undefined2 *)(lVar2 + -0x7ea) = 0x20;
  *(undefined2 *)(lVar2 + -0x7e5) = 0x20;
  *(undefined4 *)(lVar2 + -0x7e9) = 0x3a202920;
  pcVar10 = (char *)(lVar2 + -0x7e4);
  uVar4 = snprintf(pcVar10,0x7e4,"%d",0x20e);
  if ((int)uVar4 < 0) {
LAB_00119d95:
    *pcVar10 = '\0';
  }
  else if (0x7e3 < uVar4) {
    pcVar10 = (char *)(lVar2 + -1);
    goto LAB_00119d95;
  }
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,1,__s);
  iVar5 = uv_tcp_init((long)pvVar1 + 0x90,*(undefined8 *)((long)pvVar1 + 8));
  if (iVar5 == 0) {
    lVar3 = *(long *)((long)pvVar1 + 8);
    *(long *)lVar3 = lVar3;
    *(void **)(lVar3 + 0x1d8) = pvVar1;
    if (*(char *)((long)pvVar1 + 0x5bc) == '\x01') {
      iVar5 = uv_ip6_addr(*(undefined8 *)((long)pvVar1 + 0x598),
                          *(undefined4 *)((long)pvVar1 + 0x5b8),local_4c);
      if (iVar5 == 0) {
LAB_0011a325:
        iVar5 = uv_tcp_connect((long)pvVar1 + 0x3f0,*(undefined8 *)((long)pvVar1 + 8),local_4c,
                               AfterConnect);
        if (iVar5 == 0) {
          return;
        }
        GetUVError_abi_cxx11_(&local_d0,iVar5);
        uVar4 = 0;
        uVar6 = snprintf(__s,0x800,"%s",local_d0._M_dataplus._M_p);
        pcVar10 = __s;
        if ((int)uVar6 < 0) {
LAB_0011a38b:
          *pcVar10 = '\0';
        }
        else {
          uVar4 = uVar6;
          if (0x7ff < uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            uVar4 = 0x800;
            goto LAB_0011a38b;
          }
        }
        uVar9 = (ulong)uVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (uVar4 < 0x800) {
          pcVar10 = __s + uVar9;
          uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ( ");
          uVar4 = 0;
          if ((int)uVar6 < 0) {
LAB_0011a3f2:
            uVar6 = uVar4;
            *pcVar10 = '\0';
          }
          else {
            uVar4 = (uint)(0x800 - uVar9);
            if (uVar4 <= uVar6) {
              pcVar10 = (char *)(lVar2 + -1);
              goto LAB_0011a3f2;
            }
          }
          uVar9 = uVar9 + uVar6;
        }
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a448:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a448;
          }
        }
        uVar9 = uVar9 + uVar6;
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ) : ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a49e:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a49e;
          }
        }
        uVar9 = uVar9 + uVar6;
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        __maxlen = 0x800 - uVar9;
        uVar8 = 0x22d;
      }
      else {
        GetUVError_abi_cxx11_(&local_90,iVar5);
        uVar4 = 0;
        uVar6 = snprintf(__s,0x800,"%s",local_90._M_dataplus._M_p);
        pcVar10 = __s;
        if ((int)uVar6 < 0) {
LAB_0011a01b:
          *pcVar10 = '\0';
        }
        else {
          uVar4 = uVar6;
          if (0x7ff < uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            uVar4 = 0x800;
            goto LAB_0011a01b;
          }
        }
        uVar9 = (ulong)uVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (uVar4 < 0x800) {
          pcVar10 = __s + uVar9;
          uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ( ");
          uVar4 = 0;
          if ((int)uVar6 < 0) {
LAB_0011a082:
            uVar6 = uVar4;
            *pcVar10 = '\0';
          }
          else {
            uVar4 = (uint)(0x800 - uVar9);
            if (uVar4 <= uVar6) {
              pcVar10 = (char *)(lVar2 + -1);
              goto LAB_0011a082;
            }
          }
          uVar9 = uVar9 + uVar6;
        }
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a0d8:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a0d8;
          }
        }
        uVar9 = uVar9 + uVar6;
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ) : ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a12e:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a12e;
          }
        }
        uVar9 = uVar9 + uVar6;
        if (0x7ff < uVar9) goto LAB_0011a4f0;
        pcVar10 = __s + uVar9;
        __maxlen = 0x800 - uVar9;
        uVar8 = 0x21c;
      }
LAB_0011a4d2:
      uVar4 = snprintf(pcVar10,__maxlen,"%d",uVar8);
      if (-1 < (int)uVar4) {
        if (uVar4 < (uint)__maxlen) goto LAB_0011a4f0;
        pcVar10 = (char *)(lVar2 + -1);
      }
      *pcVar10 = '\0';
    }
    else {
      iVar5 = uv_ip4_addr(*(undefined8 *)((long)pvVar1 + 0x598),
                          *(undefined4 *)((long)pvVar1 + 0x5b8),local_4c);
      if (iVar5 == 0) goto LAB_0011a325;
      GetUVError_abi_cxx11_(&local_b0,iVar5);
      uVar4 = 0;
      uVar6 = snprintf(__s,0x800,"%s",local_b0._M_dataplus._M_p);
      pcVar10 = __s;
      if ((int)uVar6 < 0) {
LAB_0011a1d5:
        *pcVar10 = '\0';
      }
      else {
        uVar4 = uVar6;
        if (0x7ff < uVar6) {
          pcVar10 = (char *)(lVar2 + -1);
          uVar4 = 0x800;
          goto LAB_0011a1d5;
        }
      }
      uVar9 = (ulong)uVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (uVar4 < 0x800) {
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ( ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a23c:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a23c;
          }
        }
        uVar9 = uVar9 + uVar6;
      }
      if (uVar9 < 0x800) {
        pcVar10 = __s + uVar9;
        uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ");
        uVar4 = 0;
        if ((int)uVar6 < 0) {
LAB_0011a292:
          uVar6 = uVar4;
          *pcVar10 = '\0';
        }
        else {
          uVar4 = (uint)(0x800 - uVar9);
          if (uVar4 <= uVar6) {
            pcVar10 = (char *)(lVar2 + -1);
            goto LAB_0011a292;
          }
        }
        uVar9 = uVar9 + uVar6;
        if (uVar9 < 0x800) {
          pcVar10 = __s + uVar9;
          uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ) : ");
          uVar4 = 0;
          if ((int)uVar6 < 0) {
LAB_0011a2e8:
            uVar6 = uVar4;
            *pcVar10 = '\0';
          }
          else {
            uVar4 = (uint)(0x800 - uVar9);
            if (uVar4 <= uVar6) {
              pcVar10 = (char *)(lVar2 + -1);
              goto LAB_0011a2e8;
            }
          }
          uVar9 = uVar9 + uVar6;
          if (uVar9 < 0x800) {
            pcVar10 = __s + uVar9;
            __maxlen = 0x800 - uVar9;
            uVar8 = 0x225;
            goto LAB_0011a4d2;
          }
        }
      }
    }
LAB_0011a4f0:
    pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
    uv_close(*(undefined8 *)((long)pvVar1 + 8),0);
    goto LAB_0011a514;
  }
  GetUVError_abi_cxx11_(&local_70,iVar5);
  uVar6 = snprintf(__s,0x800,"%s",local_70._M_dataplus._M_p);
  pcVar10 = __s;
  uVar4 = 0;
  if ((int)uVar6 < 0) {
LAB_00119e12:
    uVar6 = uVar4;
    *pcVar10 = '\0';
  }
  else if (0x7ff < uVar6) {
    pcVar10 = (char *)(lVar2 + -1);
    uVar4 = 0x800;
    goto LAB_00119e12;
  }
  uVar9 = (ulong)uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (uVar6 < 0x800) {
    pcVar10 = __s + uVar9;
    uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ( ");
    uVar4 = 0;
    if ((int)uVar6 < 0) {
LAB_00119e79:
      uVar6 = uVar4;
      *pcVar10 = '\0';
    }
    else {
      uVar4 = (uint)(0x800 - uVar9);
      if (uVar4 <= uVar6) {
        pcVar10 = (char *)(lVar2 + -1);
        goto LAB_00119e79;
      }
    }
    uVar9 = uVar9 + uVar6;
  }
  if (uVar9 < 0x800) {
    pcVar10 = __s + uVar9;
    uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ");
    uVar4 = 0;
    if ((int)uVar6 < 0) {
LAB_00119ecf:
      uVar6 = uVar4;
      *pcVar10 = '\0';
    }
    else {
      uVar4 = (uint)(0x800 - uVar9);
      if (uVar4 <= uVar6) {
        pcVar10 = (char *)(lVar2 + -1);
        goto LAB_00119ecf;
      }
    }
    uVar9 = uVar9 + uVar6;
    if (uVar9 < 0x800) {
      pcVar10 = __s + uVar9;
      uVar6 = snprintf(pcVar10,0x800 - uVar9,"%s"," ) : ");
      uVar4 = 0;
      if ((int)uVar6 < 0) {
LAB_00119f25:
        uVar6 = uVar4;
        *pcVar10 = '\0';
      }
      else {
        uVar4 = (uint)(0x800 - uVar9);
        if (uVar4 <= uVar6) {
          pcVar10 = (char *)(lVar2 + -1);
          goto LAB_00119f25;
        }
      }
      uVar9 = uVar9 + uVar6;
      if (uVar9 < 0x800) {
        pcVar10 = __s + uVar9;
        uVar4 = snprintf(pcVar10,0x800 - uVar9,"%d",0x212);
        if (-1 < (int)uVar4) {
          if (uVar4 < (uint)(0x800 - uVar9)) goto LAB_00119f77;
          pcVar10 = (char *)(lVar2 + -1);
        }
        *pcVar10 = '\0';
      }
    }
  }
LAB_00119f77:
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
LAB_0011a514:
  uv_timer_stop(handle);
  lVar2 = *(long *)((long)pvVar1 + 0x590) * 2;
  *(long *)((long)pvVar1 + 0x590) = lVar2;
  uv_timer_start(handle,ReconnectTimer,lVar2);
  return;
}

Assistant:

void TCPClient::ReconnectTimer(uv_timer_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    if (!theclass->isreconnecting_) {
        return;
    }
    LOGI("start reconnect...\n");
    do {
        int iret = uv_tcp_init(&theclass->loop_, &theclass->client_handle_->tcphandle);
        if (iret) {
            LOGE(GetUVError(iret));
            break;
        }
        theclass->client_handle_->tcphandle.data = theclass->client_handle_;
        theclass->client_handle_->parent_server = theclass;
        struct sockaddr* pAddr;
        if (theclass->isIPv6_) {
            struct sockaddr_in6 bind_addr;
            int iret = uv_ip6_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        } else {
            struct sockaddr_in bind_addr;
            int iret = uv_ip4_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        }
        iret = uv_tcp_connect(&theclass->connect_req_, &theclass->client_handle_->tcphandle, (const sockaddr*)pAddr, AfterConnect);
        if (iret) {
            LOGE(GetUVError(iret));
            uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
            break;
        }
        return;
    } while (0);
    //reconnect failure, restart timer to trigger reconnect.
    uv_timer_stop(handle);
    theclass->repeat_time_ *= 2;
    uv_timer_start(handle, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
}